

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableEnumFieldGenerator::GenerateMergingCode
          (ImmutableEnumFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  char *pcVar2;
  string_view text;
  string_view text_00;
  string_view text_01;
  size_t sStack_20;
  
  bVar1 = FieldDescriptor::has_presence(this->descriptor_);
  if (bVar1) {
    pcVar2 = "if (other.has$capitalized_name$()) {\n";
    sStack_20 = 0x25;
  }
  else {
    pcVar2 = "if (other.$name$_ != $default_number$) {\n";
    sStack_20 = 0x29;
  }
  text_00._M_str = pcVar2;
  text_00._M_len = sStack_20;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&this->variables_,text_00);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  bVar1 = SupportUnknownEnumValue(this->descriptor_);
  if (bVar1) {
    pcVar2 = "set$capitalized_name$Value(other.get$capitalized_name$Value());\n";
    sStack_20 = 0x40;
  }
  else {
    pcVar2 = "set$capitalized_name$(other.get$capitalized_name$());\n";
    sStack_20 = 0x36;
  }
  text_01._M_str = pcVar2;
  text_01._M_len = sStack_20;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&this->variables_,text_01);
  io::Printer::Outdent(printer);
  text._M_str = "}\n";
  text._M_len = 2;
  io::Printer::Print<>(printer,text);
  return;
}

Assistant:

void ImmutableEnumFieldGenerator::GenerateMergingCode(
    io::Printer* printer) const {
  if (descriptor_->has_presence()) {
    printer->Print(variables_, "if (other.has$capitalized_name$()) {\n");
  } else {
    printer->Print(variables_, "if (other.$name$_ != $default_number$) {\n");
  }
  printer->Indent();
  if (SupportUnknownEnumValue(descriptor_)) {
    printer->Print(
        variables_,
        "set$capitalized_name$Value(other.get$capitalized_name$Value());\n");
  } else {
    printer->Print(variables_,
                   "set$capitalized_name$(other.get$capitalized_name$());\n");
  }
  printer->Outdent();
  printer->Print("}\n");
}